

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

nghttp2_outbound_item * nghttp2_stream_next_outbound_item(nghttp2_stream *stream)

{
  int iVar1;
  nghttp2_pq_entry *local_28;
  nghttp2_stream *si;
  nghttp2_pq_entry *ent;
  nghttp2_stream *stream_local;
  
  ent = &stream->pq_entry;
  do {
    iVar1 = stream_active((nghttp2_stream *)ent);
    if (iVar1 != 0) {
      for (local_28 = ent; local_28[0xc].index != 0;
          local_28 = (nghttp2_pq_entry *)local_28[0xc].index) {
        *(size_t *)(local_28[0xc].index + 0x40) = local_28[9].index;
      }
      return (nghttp2_outbound_item *)ent[0x13].index;
    }
    ent = nghttp2_pq_top((nghttp2_pq *)(ent + 1));
  } while (ent != (nghttp2_pq_entry *)0x0);
  return (nghttp2_outbound_item *)0x0;
}

Assistant:

nghttp2_outbound_item *
nghttp2_stream_next_outbound_item(nghttp2_stream *stream) {
  nghttp2_pq_entry *ent;
  nghttp2_stream *si;

  for (;;) {
    if (stream_active(stream)) {
      /* Update ascendant's descendant_last_cycle here, so that we can
         assure that new stream is scheduled based on it. */
      for (si = stream; si->dep_prev; si = si->dep_prev) {
        si->dep_prev->descendant_last_cycle = si->cycle;
      }
      return stream->item;
    }
    ent = nghttp2_pq_top(&stream->obq);
    if (!ent) {
      return NULL;
    }
    stream = nghttp2_struct_of(ent, nghttp2_stream, pq_entry);
  }
}